

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1592.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  CURLcode CVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  timeval tVar7;
  timeval older;
  __time_t local_60;
  __suseconds_t local_58;
  CURLMcode ec_5;
  CURLMcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  int timeout;
  CURLMcode res;
  CURL *curl;
  CURLM *multiHandle;
  char *pcStack_18;
  int stillRunning;
  char *URL_local;
  
  _timeout = 0;
  ec = CURLE_OK;
  pcStack_18 = URL;
  CVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (CVar2 != CURLE_OK) {
    uVar4 = curl_easy_strerror(CVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1592.c"
                  ,0x31,CVar2,uVar4);
    ec = CVar2;
  }
  if (ec == CURLE_OK) {
    lVar5 = curl_multi_init();
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1592.c"
                    ,0x33);
      ec = CURLE_QUIC_CONNECT_ERROR|CURLE_OUT_OF_MEMORY;
    }
    if (ec == CURLE_OK) {
      _timeout = curl_easy_init();
      if (_timeout == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1592.c"
                      ,0x35);
        ec = CURLE_QUIC_CONNECT_ERROR|CURLE_OPERATION_TIMEDOUT;
      }
      if (ec == CURLE_OK) {
        CVar2 = curl_easy_setopt(_timeout,0x29,1);
        uVar1 = _stderr;
        if (CVar2 != CURLE_OK) {
          uVar4 = curl_easy_strerror(CVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1592.c"
                        ,0x37,CVar2,uVar4);
          ec = CVar2;
        }
        if (ec == CURLE_OK) {
          CVar2 = curl_easy_setopt(_timeout,0x2712,pcStack_18);
          uVar1 = _stderr;
          if (CVar2 != CURLE_OK) {
            uVar4 = curl_easy_strerror(CVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1592.c"
                          ,0x38,CVar2,uVar4);
            ec = CVar2;
          }
          if (ec == CURLE_OK) {
            iVar3 = curl_easy_setopt(_timeout,0x27e3,"0.0.0.0");
            if (iVar3 == 0) {
              ec_1 = 4000;
            }
            else {
              curl_mfprintf(_stderr,
                            "CURLOPT_DNS_SERVERS not supported; assuming curl_multi_remove_handle() will block\n"
                           );
              ec_1 = 1000;
            }
            CVar2 = curl_easy_setopt(_timeout,0x9b,ec_1);
            uVar1 = _stderr;
            if (CVar2 != CURLE_OK) {
              uVar4 = curl_easy_strerror(CVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1592.c"
                            ,0x58,CVar2,uVar4);
              ec = CVar2;
            }
            if (ec == CURLE_OK) {
              CVar2 = curl_multi_add_handle(lVar5,_timeout);
              uVar1 = _stderr;
              if (CVar2 != CURLE_OK) {
                uVar4 = curl_multi_strerror(CVar2);
                curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1592.c"
                              ,0x5a,CVar2,uVar4);
                ec = CVar2;
              }
              if (ec == CURLE_OK) {
                curl_mfprintf(_stderr,"curl_multi_perform()...\n");
                CVar2 = curl_multi_perform(lVar5,(long)&multiHandle + 4);
                uVar1 = _stderr;
                if (CVar2 == CURLE_OK) {
                  if (multiHandle._4_4_ < 0) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1592.c"
                                  ,0x5e,multiHandle._4_4_);
                    ec = CURLE_QUIC_CONNECT_ERROR|CURLE_READ_ERROR;
                  }
                }
                else {
                  uVar4 = curl_multi_strerror(CVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1592.c"
                                ,0x5e,CVar2,uVar4);
                  ec = CVar2;
                }
                if (ec == CURLE_OK) {
                  curl_mfprintf(_stderr,"curl_multi_perform() succeeded\n");
                  curl_mfprintf(_stderr,"curl_multi_remove_handle()...\n");
                  tVar7 = tutil_tvnow();
                  local_60 = tVar7.tv_sec;
                  tv_test_start.tv_sec = local_60;
                  local_58 = tVar7.tv_usec;
                  tv_test_start.tv_usec = local_58;
                  ec = curl_multi_remove_handle(lVar5,_timeout);
                  if (ec == CURLE_OK) {
                    curl_mfprintf(_stderr,"curl_multi_remove_handle() succeeded\n");
                    tVar7 = tutil_tvnow();
                    older.tv_usec = tv_test_start.tv_usec;
                    older.tv_sec = tv_test_start.tv_sec;
                    lVar6 = tutil_tvdiff(tVar7,older);
                    if (2000 < lVar6) {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1592.c"
                                    ,0x6f);
                      ec = CURLE_QUIC_CONNECT_ERROR|CURLE_OBSOLETE29;
                    }
                  }
                  else {
                    curl_mfprintf(_stderr,"curl_multi_remove_handle() failed, with code %d\n",ec);
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(_timeout);
    curl_multi_cleanup(lVar5);
    curl_global_cleanup();
    URL_local._4_4_ = ec;
  }
  else {
    URL_local._4_4_ = ec;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int stillRunning;
  CURLM *multiHandle = NULL;
  CURL *curl = NULL;
  CURLMcode res = CURLM_OK;
  int timeout;

  global_init(CURL_GLOBAL_ALL);

  multi_init(multiHandle);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_URL, URL);

  /* Set a DNS server that hopefully will not respond when using c-ares. */
  if(curl_easy_setopt(curl, CURLOPT_DNS_SERVERS, "0.0.0.0") == CURLE_OK)
    /* Since we could set the DNS server, presume we are working with a
       resolver that can be cancelled (i.e. c-ares).  Thus,
       curl_multi_remove_handle() should not block even when the resolver
       request is outstanding.  So, set a request timeout _longer_ than the
       test hang timeout so we will fail if the handle removal call incorrectly
       blocks. */
    timeout = TEST_HANG_TIMEOUT * 2;
  else {
    /* If we can't set the DNS server, presume that we are configured to use a
       resolver that can't be cancelled (i.e. the threaded resolver or the
       non-threaded blocking resolver).  So, we just test that the
       curl_multi_remove_handle() call does finish well within our test
       timeout.

       But, it is very unlikely that the resolver request will take any time at
       all because we haven't been able to configure the resolver to use an
       non-responsive DNS server.  At least we exercise the flow.
       */
    fprintf(stderr,
            "CURLOPT_DNS_SERVERS not supported; "
            "assuming curl_multi_remove_handle() will block\n");
    timeout = TEST_HANG_TIMEOUT / 2;
  }

  /* Setting a timeout on the request should ensure that even if we have to
     wait for the resolver during curl_multi_remove_handle(), it won't take
     longer than this, because the resolver request inherits its timeout from
     this. */
  easy_setopt(curl, CURLOPT_TIMEOUT_MS, timeout);

  multi_add_handle(multiHandle, curl);

  /* This should move the handle from INIT => CONNECT => WAITRESOLVE. */
  fprintf(stderr, "curl_multi_perform()...\n");
  multi_perform(multiHandle, &stillRunning);
  fprintf(stderr, "curl_multi_perform() succeeded\n");

  /* Start measuring how long it takes to remove the handle. */
  fprintf(stderr, "curl_multi_remove_handle()...\n");
  start_test_timing();
  res = curl_multi_remove_handle(multiHandle, curl);
  if(res) {
    fprintf(stderr, "curl_multi_remove_handle() failed, "
            "with code %d\n", (int)res);
    goto test_cleanup;
  }
  fprintf(stderr, "curl_multi_remove_handle() succeeded\n");

  /* Fail the test if it took too long to remove.  This happens after the fact,
     and says "it seems that it would have run forever", which isn't true, but
     it's close enough, and simple to do. */
  abort_on_test_timeout();

test_cleanup:
  curl_easy_cleanup(curl);
  curl_multi_cleanup(multiHandle);
  curl_global_cleanup();

  return (int)res;
}